

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool tinyxml2::XMLUtil::ToUnsigned64(char *str,uint64_t *value)

{
  bool bVar1;
  int iVar2;
  char *local_38;
  undefined8 local_28;
  unsigned_long_long v;
  uint64_t *value_local;
  char *str_local;
  
  local_28 = 0;
  v = (unsigned_long_long)value;
  value_local = (uint64_t *)str;
  bVar1 = IsPrefixHex(str);
  if (bVar1) {
    local_38 = "%llx";
  }
  else {
    local_38 = "%llu";
  }
  iVar2 = __isoc99_sscanf(str,local_38,&local_28);
  if (iVar2 == 1) {
    *(undefined8 *)v = local_28;
  }
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned64(const char* str, uint64_t* value) {
    unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llu
    if(TIXML_SSCANF(str, IsPrefixHex(str) ? "%llx" : "%llu", &v) == 1) {
        *value = (uint64_t)v;
        return true;
    }
    return false;
}